

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools.cxx
# Opt level: O3

void __thiscall level_tools::level_tools(level_tools *this)

{
  (this->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__level_tools_00246260;
  (this->super_xr_surface_factory)._vptr_xr_surface_factory =
       (_func_int **)&PTR__level_tools_00246290;
  this->m_ini = (xr_ini_file *)0x0;
  (this->m_mu_models).super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_mu_models).super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_mu_models).super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_shaders_xrlc_lib = (xr_shaders_xrlc_lib *)0x0;
  this->m_level = (xr_level *)0x0;
  this->m_scene = (xr_scene *)0x0;
  (this->m_uniq_textures).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_uniq_textures).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_uniq_textures).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_uniq_shaders).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_uniq_shaders).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_uniq_shaders).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_objects_ref)._M_dataplus._M_p = (pointer)&(this->m_objects_ref).field_2;
  (this->m_objects_ref)._M_string_length = 0;
  (this->m_objects_ref).field_2._M_local_buf[0] = '\0';
  this->m_sg_val = (char *)0x0;
  this->m_sg_type = SOC;
  return;
}

Assistant:

level_tools::level_tools():
	m_ini(0),
	m_shaders_xrlc_lib(0),
	m_level(0), m_scene(0) {}